

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void LowererMD::Legalize<false>(Instr *instr,bool fPostRegAlloc)

{
  IRType IVar1;
  OpCode OVar2;
  Opnd *this;
  Opnd *this_00;
  code *pcVar3;
  bool bVar4;
  RegNum RVar5;
  OpndKind OVar6;
  OpCode OVar7;
  BOOL BVar8;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  IntConstOpnd *pIVar12;
  Instr *pIVar13;
  RegOpnd *pRVar14;
  MemRefOpnd *pMVar15;
  int64 iVar16;
  char *pcVar17;
  LegalForms src1Forms;
  char *pcVar18;
  LegalForms dstForms;
  uint uVar19;
  size_t extendedValue;
  LegalForms src2Forms;
  LegalInstrForms *pLVar20;
  undefined1 local_60 [8];
  IntConstOpnd *intConstantSrc;
  anon_class_1_0_00000001 getRegMask;
  Instr *instr_local;
  IRType dstType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x5c6,"(instr)","instr");
    if (!bVar4) goto LAB_005e47e4;
    *puVar11 = 0;
  }
  if (((instr->field_0x36 & 0x20) != 0) &&
     ((instr->m_opcode != MOV || (bVar4 = IR::Opnd::IsIntConstOpnd(instr->m_src1), !bVar4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x5c8,
                       "(!instr->isInlineeEntryInstr || (instr->m_opcode == Js::OpCode::MOV && instr->GetSrc1()->IsIntConstOpnd()))"
                       ,
                       "!instr->isInlineeEntryInstr || (instr->m_opcode == Js::OpCode::MOV && instr->GetSrc1()->IsIntConstOpnd())"
                      );
    if (!bVar4) goto LAB_005e47e4;
    *puVar11 = 0;
  }
  OVar2 = instr->m_opcode;
  if (OVar2 < ADD) {
    bVar4 = Lowerer::ValidOpcodeAfterLower(instr,instr->m_func);
    pLVar20 = (LegalInstrForms *)&LegalInstrFormsImpl::LEGAL_NONE;
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x5cb,
                         "(isMDOpCode || Lowerer::ValidOpcodeAfterLower(instr, instr->m_func))",
                         "isMDOpCode || Lowerer::ValidOpcodeAfterLower(instr, instr->m_func)");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
  }
  else {
    pLVar20 = AllLegalInstrForms + (OVar2 - 0x3d5);
  }
  dstForms = pLVar20->dst;
  src1Forms = pLVar20->src[0];
  src2Forms = pLVar20->src[1];
  OVar7 = instr->m_opcode;
  switch(OVar7) {
  case CMOVA:
  case CMOVAE:
  case CMOVB:
  case CMOVBE:
  case CMOVE:
  case CMOVG:
  case CMOVGE:
  case CMOVL:
  case CMOVLE:
  case CMOVNE:
  case CMOVNO:
  case CMOVNP:
  case CMOVNS:
  case CMOVO:
  case CMOVP:
  case CMOVS:
    iVar10 = TySize[instr->m_dst->m_type];
    if (instr->m_src2 == (Opnd *)0x0) {
      if (iVar10 != TySize[instr->m_src1->m_type]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6b8,"(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())",
                           "instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()");
        if (!bVar4) goto LAB_005e47e4;
        *puVar11 = 0;
      }
LAB_005e39a9:
      dstForms = L_Reg;
      src1Forms = L_Mem|L_Reg;
      goto LAB_005e39b2;
    }
    if (iVar10 != TySize[instr->m_src2->m_type]) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6a6,"(instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize())",
                         "instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize()");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      iVar10 = TySize[instr->m_dst->m_type];
    }
    if (iVar10 != TySize[instr->m_src1->m_type]) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6a7,"(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())",
                         "instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    bVar4 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
    if ((bVar4) &&
       (pIVar12 = IR::Opnd::AsIntConstOpnd(instr->m_src2),
       (pIVar12->super_EncodableOpnd<long>).m_value == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6ae,
                         "(!instr->GetSrc2()->IsIntConstOpnd() || instr->GetSrc2()->AsIntConstOpnd()->GetValue() != 0)"
                         ,
                         "!instr->GetSrc2()->IsIntConstOpnd() || instr->GetSrc2()->AsIntConstOpnd()->GetValue() != 0"
                        );
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    src1Forms = L_Reg;
    src2Forms = L_Mem|L_Reg;
    dstForms = src1Forms;
    goto LAB_005e4025;
  case CMP:
  case CMPEQPD:
  case CMPEQPS:
  case CMPLEPD:
  case CMPLEPS:
  case CMPLTPD:
  case CMPLTPS:
  case CMPNEQPD:
  case CMPNEQPS:
  case CMPUNORDPS:
  case COMISD:
  case COMISS:
  case CQO:
  case CVTDQ2PD:
  case CVTDQ2PS:
  case CVTPD2PS:
  case CVTPS2PD:
  case CVTSD2SI:
  case CVTSD2SS:
  case CVTSI2SD:
  case CVTSI2SS:
  case CVTSS2SD:
  case CVTSS2SI:
  case CVTTPD2DQ:
  case CVTTPS2DQ:
  case CVTTSD2SI:
  case CVTTSS2SI:
  case DEC:
  case DIV:
  case DIVPD:
  case DIVPS:
  case DIVSD:
  case DIVSS:
  case IDIV:
  case IMUL:
  case IMUL2:
  case INC:
  case INT:
  case LEA:
  case LOCKOR:
  case MAXPD:
  case MAXPS:
  case MINPD:
  case MINPS:
  case MOV_TRUNC:
  case MOVAPD:
  case MOVAPS:
  case MOVD:
  case MOVHLPS:
  case MOVHPD:
  case MOVLHPS:
  case MOVLPD:
  case MOVMSKPD:
  case MOVMSKPS:
  case MOVQ:
  case MOVSD_ZERO:
  case MOVSXD:
    break;
  case CMPXCHG8B:
  case LOCKCMPXCHG8B:
    uVar9 = *(uint *)&instr->m_func->field_0x240;
    if (((uVar9 >> 0x19 & 1) != 0) && (instr->m_dst != (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6f3,"(!instr->m_func->isPostFinalLower || !instr->GetDst())",
                         "After FinalLower, there should not be a dst");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      uVar9 = *(uint *)&instr->m_func->field_0x240;
    }
    if (((uVar9 >> 0x19 & 1) == 0) &&
       (iVar10 = Legalize<false>::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)&intConstantSrc,instr->m_dst), iVar10 != 10))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6f5,
                         "(instr->m_func->isPostFinalLower || getRegMask(instr->GetDst()) == dstMask)"
                         ,"Before FinalLower, instr should have eax,edx as dst");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    uVar9 = *(uint *)&instr->m_func->field_0x240;
    if (((uVar9 >> 0x19 & 1) != 0) && (instr->m_src2 != (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6f6,"(!instr->m_func->isPostFinalLower || !instr->GetSrc2())",
                         "After FinalLower, there should not be a src2");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      uVar9 = *(uint *)&instr->m_func->field_0x240;
    }
    if (((uVar9 >> 0x19 & 1) == 0) &&
       (iVar10 = Legalize<false>::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)&intConstantSrc,instr->m_src2),
       iVar10 != 0x1e)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6f8,
                         "(instr->m_func->isPostFinalLower || getRegMask(instr->GetSrc2()) == srcMask)"
                         ,"Before FinalLower, instr should have eax,edx,ecx,ebx as src2");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    LegalizeSrc<false>(instr,instr->m_src1,L_Mem);
    goto LAB_005e402a;
  case JA:
  case JAE:
  case JB:
  case JBE:
  case JEQ:
  case JGE:
  case JGT:
  case JLE:
  case JLT:
  case JMP:
  case JNE:
  case JNO:
  case JNP:
  case JNSB:
  case JO:
  case JP:
  case JSB:
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      pcVar18 = "(instr->IsBranchInstr())";
      pcVar17 = "instr->IsBranchInstr()";
      uVar19 = 0x5e7;
LAB_005e3706:
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,uVar19,pcVar18,pcVar17);
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    goto LAB_005e402a;
  case LZCNT:
    BVar8 = AutoSystemInfo::LZCntAvailable(&AutoSystemInfo::Data);
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      instr_local._7_1_ = src2Forms;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      pcVar18 = "(AutoSystemInfo::Data.LZCntAvailable())";
      pcVar17 = "AutoSystemInfo::Data.LZCntAvailable()";
      uVar19 = 0x726;
LAB_005e3f12:
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,uVar19,pcVar18,pcVar17);
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      src2Forms = instr_local._7_1_;
    }
    break;
  case MOV:
    if (instr->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x5ec,"(instr->GetSrc2() == nullptr)","instr->GetSrc2() == nullptr");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    this = instr->m_dst;
    instr_local._6_1_ = this->m_type;
    this_00 = instr->m_src1;
    IVar1 = this_00->m_type;
    if (TySize[IVar1] < TySize[instr_local._6_1_]) {
      if ((0x17 < instr_local._6_1_) || ((0x800198U >> (instr_local._6_1_ & 0x1f) & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x605,"(false)","false");
        if (!bVar4) goto LAB_005e47e4;
        *puVar11 = 0;
      }
      bVar4 = IR::Opnd::IsIntConstOpnd(this_00);
      if (bVar4) {
        local_60 = (undefined1  [8])IR::Opnd::AsIntConstOpnd(this_00);
      }
      else {
        local_60 = (undefined1  [8])0x0;
      }
      intConstantSrc = (IntConstOpnd *)local_60;
      _getRegMask = (IRType *)((long)&instr_local + 6);
      switch(IVar1) {
      case TyInt8:
        if (local_60 == (undefined1  [8])0x0) {
          instr->m_opcode = MOVSX;
        }
        else {
          extendedValue =
               (size_t)(char)(((IntConstOpnd *)local_60)->super_EncodableOpnd<long>).m_value;
LAB_005e46d9:
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&intConstantSrc,extendedValue);
        }
        break;
      case TyInt16:
        if (local_60 != (undefined1  [8])0x0) {
          extendedValue =
               (size_t)(short)(((IntConstOpnd *)local_60)->super_EncodableOpnd<long>).m_value;
          goto LAB_005e46d9;
        }
        instr->m_opcode = MOVSXW;
        break;
      case TyInt32:
        if (local_60 != (undefined1  [8])0x0) {
          extendedValue =
               (size_t)(int)(((IntConstOpnd *)local_60)->super_EncodableOpnd<long>).m_value;
          goto LAB_005e46d9;
        }
        instr->m_opcode = MOVSXD;
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        uVar19 = 0x66f;
LAB_005e469b:
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,uVar19,"(false)","false");
        if (!bVar4) goto LAB_005e47e4;
        *puVar11 = 0;
        break;
      case TyUint8:
        if (local_60 != (undefined1  [8])0x0) {
          extendedValue =
               (size_t)(byte)(((IntConstOpnd *)local_60)->super_EncodableOpnd<long>).m_value;
          goto LAB_005e46d9;
        }
        instr->m_opcode = MOVZX;
        break;
      case TyUint16:
        if (local_60 != (undefined1  [8])0x0) {
          extendedValue =
               (size_t)(ushort)(((IntConstOpnd *)local_60)->super_EncodableOpnd<long>).m_value;
          goto LAB_005e46d9;
        }
        instr->m_opcode = MOVZXW;
        break;
      case TyUint32:
        if (local_60 != (undefined1  [8])0x0) {
          extendedValue =
               (size_t)(uint)(((IntConstOpnd *)local_60)->super_EncodableOpnd<long>).m_value;
          goto LAB_005e46d9;
        }
        OVar6 = IR::Opnd::GetKind(this);
        switch(OVar6) {
        case OpndKindSym:
        case OpndKindIndir:
        case OpndKindMemRef:
          IR::Instr::HoistSrc1(instr,MOV_TRUNC,RegNOREG,(StackSym *)0x0);
          instr->m_src1->m_type = instr_local._6_1_;
          break;
        case OpndKindReg:
          this->m_type = TyUint32;
          instr->m_opcode = MOV_TRUNC;
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          uVar19 = 0x668;
          goto LAB_005e469b;
        }
      }
    }
    else if (TySize[instr_local._6_1_] < TySize[IVar1]) {
      this_00->m_type = instr_local._6_1_;
    }
    if (instr->m_opcode != MOV) goto LAB_005e39a9;
    bVar4 = IR::Opnd::IsMemoryOpnd(this);
    src1Forms = L_Ptr|L_Mem|L_Reg;
    if (bVar4) {
      src1Forms = L_Imm32|L_Reg;
    }
    dstForms = L_Mem|L_Reg;
LAB_005e39b2:
    src2Forms = L_None;
    goto LAB_005e4025;
  case MOVSD:
  case MOVSS:
    if (((IRType)((OVar7 == MOVSD) + TyFloat32) != instr->m_dst->m_type) &&
       (bVar4 = IR::Opnd::IsSimd128(instr->m_dst), !bVar4)) {
      AssertCount = AssertCount + 1;
      instr_local._7_1_ = src2Forms;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6c3,
                         "(instr->GetDst()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD? TyFloat64 : TyFloat32) || instr->GetDst()->IsSimd128())"
                         ,
                         "instr->GetDst()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD? TyFloat64 : TyFloat32) || instr->GetDst()->IsSimd128()"
                        );
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      src2Forms = instr_local._7_1_;
    }
    if (((IRType)((instr->m_opcode == MOVSD) + TyFloat32) != instr->m_src1->m_type) &&
       (bVar4 = IR::Opnd::IsSimd128(instr->m_src1), !bVar4)) {
      AssertCount = AssertCount + 1;
      instr_local._7_1_ = src2Forms;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      pcVar18 = 
      "(instr->GetSrc1()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD ? TyFloat64 : TyFloat32) || instr->GetSrc1()->IsSimd128())"
      ;
      pcVar17 = 
      "instr->GetSrc1()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD ? TyFloat64 : TyFloat32) || instr->GetSrc1()->IsSimd128()"
      ;
      uVar19 = 0x6c4;
      goto LAB_005e3f12;
    }
    break;
  case MOVSX:
  case MOVSXW:
    if ((TySize[instr->m_dst->m_type] != 4) && (TySize[instr->m_dst->m_type] != 8)) {
      AssertCount = AssertCount + 1;
      instr_local._7_1_ = src2Forms;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6d5,
                         "(instr->GetDst()->GetSize() == 4 || instr->GetDst()->GetSize() == 8)",
                         "instr->GetDst()->GetSize() == 4 || instr->GetDst()->GetSize() == 8");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      OVar7 = instr->m_opcode;
      src2Forms = instr_local._7_1_;
    }
    if (OVar7 == MOVSX) {
      if (TySize[instr->m_src1->m_type] == 1) break;
      AssertCount = AssertCount + 1;
      instr_local._7_1_ = src2Forms;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6d6,
                         "(instr->m_opcode != Js::OpCode::MOVSX || instr->GetSrc1()->GetSize() == 1)"
                         ,"instr->m_opcode != Js::OpCode::MOVSX || instr->GetSrc1()->GetSize() == 1"
                        );
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
      OVar7 = instr->m_opcode;
      src2Forms = instr_local._7_1_;
    }
    if ((OVar7 == MOVSXW) && (TySize[instr->m_src1->m_type] != 2)) {
      AssertCount = AssertCount + 1;
      instr_local._7_1_ = src2Forms;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      pcVar18 = "(instr->m_opcode != Js::OpCode::MOVSXW || instr->GetSrc1()->GetSize() == 2)";
      pcVar17 = "instr->m_opcode != Js::OpCode::MOVSXW || instr->GetSrc1()->GetSize() == 2";
      uVar19 = 0x6d7;
      goto LAB_005e3f12;
    }
    break;
  default:
    if (OVar7 - 0x48d < 2) {
LAB_005e39b9:
      bVar4 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
      if (!bVar4) {
        pIVar13 = IR::Instr::HoistSrc2(instr,MOV,RegNOREG,(StackSym *)0x0);
        pRVar14 = IR::Opnd::AsRegOpnd(pIVar13->m_dst);
        instr_local._7_1_ = src2Forms;
        RVar5 = LowererMDArch::GetRegShiftCount();
        pRVar14->m_reg = RVar5;
        pRVar14 = IR::Opnd::AsRegOpnd(instr->m_src2);
        RVar5 = LowererMDArch::GetRegShiftCount();
        pRVar14->m_reg = RVar5;
        src2Forms = instr_local._7_1_;
      }
      instr->m_src2->m_type = TyUint8;
    }
    else if (OVar7 - 0x48f < 2) {
      BVar8 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        instr_local._7_1_ = src2Forms;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        pcVar18 = "(AutoSystemInfo::Data.SSE4_1Available())";
        pcVar17 = "AutoSystemInfo::Data.SSE4_1Available()";
        uVar19 = 0x72b;
        goto LAB_005e3f12;
      }
    }
    else {
      if (OVar7 == NOP) {
        if (instr->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x6c9,"(!instr->GetSrc2())","!instr->GetSrc2()");
          if (!bVar4) goto LAB_005e47e4;
          *puVar11 = 0;
        }
        if ((instr->m_dst != (Opnd *)0x0) &&
           ((bVar4 = IR::Opnd::IsRegOpnd(instr->m_dst), !bVar4 ||
            (pRVar14 = IR::Opnd::AsRegOpnd(instr->m_dst), pRVar14->m_reg != RegArg2)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          pcVar18 = 
          "(!instr->GetDst() || (instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx))"
          ;
          pcVar17 = 
          "!instr->GetDst() || (instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx)"
          ;
          uVar19 = 0x6d0;
          goto LAB_005e3706;
        }
        goto LAB_005e402a;
      }
      if (((OVar7 == SAR) || (OVar7 == SHL)) || (OVar7 == SHR)) goto LAB_005e39b9;
      if (OVar7 == TEST) {
        bVar4 = IR::Opnd::IsImmediateOpnd(instr->m_src1);
        if (((bVar4) && (bVar4 = IR::Opnd::IsImmediateOpnd(instr->m_src2), !bVar4)) ||
           ((bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_src2), bVar4 &&
            (bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_src1), !bVar4)))) {
          IR::Instr::SwapOpnds(instr);
        }
      }
      else if ((OVar7 == TZCNT) &&
              (BVar8 = AutoSystemInfo::TZCntAvailable(&AutoSystemInfo::Data), BVar8 == 0)) {
        AssertCount = AssertCount + 1;
        instr_local._7_1_ = src2Forms;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        pcVar18 = "(AutoSystemInfo::Data.TZCntAvailable())";
        pcVar17 = "AutoSystemInfo::Data.TZCntAvailable()";
        uVar19 = 0x723;
        goto LAB_005e3f12;
      }
    }
  }
  if (MDStart < OVar2) {
    if ((dstForms & LF_Custom) != L_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x732,"(!isCustomForm)",
                         "Custom legal forms should have a case in the switch statement");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    bVar4 = EncoderMD::IsOPEQ(instr);
    if ((bVar4) && (MakeDstEquSrc1<false>(instr), ((src1Forms ^ dstForms) & L_FormMask) != L_None))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x738,"((dstForms & L_FormMask) == (src1Forms & L_FormMask))",
                         "(dstForms & L_FormMask) == (src1Forms & L_FormMask)");
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
LAB_005e4025:
    LegalizeOpnds<false>(instr,dstForms,src1Forms,src2Forms);
  }
LAB_005e402a:
  if ((instr->m_dst == (Opnd *)0x0) || (bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_dst), !bVar4)) {
    if ((instr->m_src1 == (Opnd *)0x0) || (bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_src1), !bVar4)) {
      if (((instr->m_src2 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsMemRefOpnd(instr->m_src2), bVar4))
         && (pMVar15 = IR::Opnd::AsMemRefOpnd(instr->m_src2),
            (long)(int)pMVar15->m_memLoc != pMVar15->m_memLoc)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        pcVar18 = "(Math::FitsInDWord((size_t)instr->GetSrc2()->AsMemRefOpnd()->GetMemLoc()))";
        pcVar17 = "Math::FitsInDWord((size_t)instr->GetSrc2()->AsMemRefOpnd()->GetMemLoc())";
        uVar19 = 0x75d;
        goto LAB_005e4309;
      }
    }
    else {
      bVar4 = IR::Opnd::IsMemRefOpnd(instr->m_src1);
      if ((bVar4) &&
         (pMVar15 = IR::Opnd::AsMemRefOpnd(instr->m_src1),
         (long)(int)pMVar15->m_memLoc != pMVar15->m_memLoc)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x757,
                           "(!instr->GetSrc1()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetSrc1()->AsMemRefOpnd()->GetMemLoc()))"
                           ,
                           "!instr->GetSrc1()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetSrc1()->AsMemRefOpnd()->GetMemLoc())"
                          );
        if (!bVar4) goto LAB_005e47e4;
        *puVar11 = 0;
      }
      if ((instr->m_src2 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_src2), bVar4))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        pcVar18 = "(!instr->GetSrc2() || !instr->GetSrc2()->IsMemoryOpnd())";
        pcVar17 = "!instr->GetSrc2() || !instr->GetSrc2()->IsMemoryOpnd()";
        uVar19 = 0x758;
LAB_005e4309:
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,uVar19,pcVar18,pcVar17);
        if (!bVar4) goto LAB_005e47e4;
        *puVar11 = 0;
      }
    }
  }
  else {
    bVar4 = IR::Opnd::IsMemRefOpnd(instr->m_dst);
    if ((bVar4) &&
       (pMVar15 = IR::Opnd::AsMemRefOpnd(instr->m_dst),
       (long)(int)pMVar15->m_memLoc != pMVar15->m_memLoc)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x74a,
                         "(!instr->GetDst()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetDst()->AsMemRefOpnd()->GetMemLoc()))"
                         ,
                         "!instr->GetDst()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetDst()->AsMemRefOpnd()->GetMemLoc())"
                        );
      if (!bVar4) goto LAB_005e47e4;
      *puVar11 = 0;
    }
    if (instr->m_src1 != (Opnd *)0x0) {
      bVar4 = IR::Opnd::IsEqual(instr->m_src1,instr->m_dst);
      if ((!bVar4) && (bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_src1), bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x74d,
                           "(instr->GetSrc1()->IsEqual(instr->GetDst()) || !instr->GetSrc1()->IsMemoryOpnd())"
                           ,
                           "instr->GetSrc1()->IsEqual(instr->GetDst()) || !instr->GetSrc1()->IsMemoryOpnd()"
                          );
        if (!bVar4) goto LAB_005e47e4;
        *puVar11 = 0;
      }
      if ((instr->m_src2 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsMemoryOpnd(instr->m_src2), bVar4))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        pcVar18 = "(!instr->GetSrc2()->IsMemoryOpnd())";
        pcVar17 = "!instr->GetSrc2()->IsMemoryOpnd()";
        uVar19 = 0x750;
        goto LAB_005e4309;
      }
    }
  }
  if ((((instr->m_src2 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsImmediateOpnd(instr->m_src2), bVar4))
      && (TySize[instr->m_src2->m_type] == 8)) &&
     (iVar16 = IR::Opnd::GetImmediateValue(instr->m_src2,instr->m_func), (int)iVar16 != iVar16)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x762,
                       "(!instr->GetSrc2() || !instr->GetSrc2()->IsImmediateOpnd() || (TySize[instr->GetSrc2()->GetType()] != 8) || Math::FitsInDWord(instr->GetSrc2()->GetImmediateValue(instr->m_func)))"
                       ,
                       "!instr->GetSrc2() || !instr->GetSrc2()->IsImmediateOpnd() || (TySize[instr->GetSrc2()->GetType()] != 8) || Math::FitsInDWord(instr->GetSrc2()->GetImmediateValue(instr->m_func))"
                      );
    if (!bVar4) {
LAB_005e47e4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  return;
}

Assistant:

void
LowererMD::Legalize(IR::Instr *const instr, bool fPostRegAlloc)
{
    Assert(instr);
    Assert(!instr->isInlineeEntryInstr
        || (instr->m_opcode == Js::OpCode::MOV && instr->GetSrc1()->IsIntConstOpnd()));

    const bool isMDOpCode = instr->m_opcode > Js::OpCode::MDStart;
    Assert(isMDOpCode || Lowerer::ValidOpcodeAfterLower(instr, instr->m_func));

    const LegalInstrForms legalInstrForms = isMDOpCode ? AllLegalInstrForms[instr->m_opcode - (Js::OpCode::MDStart + 1)] : LegalInstrFormsImpl::LEGAL_NONE;
    LegalForms dstForms = legalInstrForms.dst;
    LegalForms src1Forms = legalInstrForms.src[0];
    LegalForms src2Forms = legalInstrForms.src[1];

    bool hasSwitchCase = true;
    bool isCustomForm = (dstForms & LF_Custom) != 0;;
    switch(instr->m_opcode)
    {
        case Js::OpCode::JA:
        case Js::OpCode::JAE:
        case Js::OpCode::JB:
        case Js::OpCode::JBE:
        case Js::OpCode::JEQ:
        case Js::OpCode::JNE:
        case Js::OpCode::JLT:
        case Js::OpCode::JLE:
        case Js::OpCode::JGT:
        case Js::OpCode::JGE:
        case Js::OpCode::JNO:
        case Js::OpCode::JO:
        case Js::OpCode::JP:
        case Js::OpCode::JNP:
        case Js::OpCode::JNSB:
        case Js::OpCode::JSB:
        case Js::OpCode::JMP:
            Assert(instr->IsBranchInstr());
            break;

        case Js::OpCode::MOV:
        {
            Assert(instr->GetSrc2() == nullptr);

            IR::Opnd *const dst = instr->GetDst();
            const IRType dstType = dst->GetType();
            IR::Opnd *const src = instr->GetSrc1();
            const IRType srcType = src->GetType();
            if(TySize[dstType] > TySize[srcType])
            {
                if (verify)
                {
                    return;
                }
            #if DBG
                switch(dstType)
                {
                    case TyInt32:
                    case TyUint32:
            #ifdef _M_X64
                    case TyInt64:
                    case TyUint64:
            #endif
                    case TyVar:
                        break;

                    default:
                        Assert(false);
                }
            #endif

                IR::IntConstOpnd *const intConstantSrc = src->IsIntConstOpnd() ? src->AsIntConstOpnd() : nullptr;
                const auto UpdateIntConstantSrc = [&](const size_t extendedValue)
                {
                    Assert(intConstantSrc);

                #ifdef _M_X64
                    if(TySize[dstType] > sizeof(IntConstType))
                    {
                        instr->ReplaceSrc1(
                            IR::AddrOpnd::New(
                                reinterpret_cast<void *>(extendedValue),
                                IR::AddrOpndKindConstantVar,
                                instr->m_func,
                                intConstantSrc->m_dontEncode));
                    }
                    else
                #endif
                    {
                        intConstantSrc->SetType(dstType);
                        intConstantSrc->SetValue(static_cast<IntConstType>(extendedValue));
                    }
                };

                switch(srcType)
                {
                    case TyInt8:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<int8>(intConstantSrc->GetValue())); // sign-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVSX;
                        break;

                    case TyUint8:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<uint8>(intConstantSrc->GetValue())); // zero-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVZX;
                        break;

                    case TyInt16:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<int16>(intConstantSrc->GetValue())); // sign-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVSXW;
                        break;

                    case TyUint16:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<uint16>(intConstantSrc->GetValue())); // zero-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVZXW;
                        break;

                #ifdef _M_X64
                    case TyInt32:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<int32>(intConstantSrc->GetValue())); // sign-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVSXD;
                        break;

                    case TyUint32:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<uint32>(intConstantSrc->GetValue())); // zero-extend
                            break;
                        }
                        switch(dst->GetKind())
                        {
                            case IR::OpndKindReg:
                                // (mov r0.u32, r1.u32) clears the upper 32 bits of r0
                                dst->SetType(TyUint32);
                                instr->m_opcode = Js::OpCode::MOV_TRUNC;
                                break;

                            case IR::OpndKindSym:
                            case IR::OpndKindIndir:
                            case IR::OpndKindMemRef:
                                // Even if the src is a reg, we don't know if the upper 32 bits are zero. Copy the value to a
                                // reg first to zero-extend it to 64 bits, and then copy the 64-bit value to the original dst.
                                instr->HoistSrc1(Js::OpCode::MOV_TRUNC);
                                instr->GetSrc1()->SetType(dstType);
                                break;

                            default:
                                Assert(false);
                                __assume(false);
                        }
                        break;
                #endif

                    default:
                        Assert(false);
                        __assume(false);
                }
            }
            else if (TySize[dstType] < TySize[srcType])
            {
                instr->GetSrc1()->SetType(dst->GetType());
            }

            if(instr->m_opcode == Js::OpCode::MOV)
            {
                // Allow 64 bit values in x64 as well
                src1Forms = L_Reg | L_Mem | L_Ptr;
#if _M_X64
                if (dst->IsMemoryOpnd())
                {
                    // Only allow <= 32 bit values
                    src1Forms = L_Reg | L_Imm32;
                }
#endif
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg | L_Mem,
                    src1Forms,
                    L_None);
            }
            else
            {
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg,
                    L_Reg | L_Mem,
                    L_None);
            }
            break;
        }

        case Js::OpCode::CMOVA:
        case Js::OpCode::CMOVAE:
        case Js::OpCode::CMOVB:
        case Js::OpCode::CMOVBE:
        case Js::OpCode::CMOVE:
        case Js::OpCode::CMOVG:
        case Js::OpCode::CMOVGE:
        case Js::OpCode::CMOVL:
        case Js::OpCode::CMOVLE:
        case Js::OpCode::CMOVNE:
        case Js::OpCode::CMOVNO:
        case Js::OpCode::CMOVNP:
        case Js::OpCode::CMOVNS:
        case Js::OpCode::CMOVO:
        case Js::OpCode::CMOVP:
        case Js::OpCode::CMOVS:
            if (instr->GetSrc2())
            {
                Assert(instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize());
                Assert(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());

                // 0 shouldn't be the src2 of a CMOVcc.
                // CMOVcc doesn't support moving a constant and the legalizer will hoist the load of the constant
                // to a register. If the constant was 0, Peeps will turn it into a XOR which, in turn, may change
                // the zero flags and hence the result of CMOVcc. If you do want to CMOVcc 0, you should load 0
                // into a register before the instruction whose result the CMOVcc depends on.
                Assert(!instr->GetSrc2()->IsIntConstOpnd() || instr->GetSrc2()->AsIntConstOpnd()->GetValue() != 0);
                // sometimes we have fake src1 to help reg alloc
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg,
                    L_Reg,
                    L_Reg | L_Mem);
            }
            else
            {
                Assert(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg,
                    L_Reg | L_Mem,
                    L_None);
            }
            break;

        case Js::OpCode::MOVSD:
        case Js::OpCode::MOVSS:
            Assert(instr->GetDst()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD? TyFloat64 : TyFloat32) || instr->GetDst()->IsSimd128());
            Assert(instr->GetSrc1()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD ? TyFloat64 : TyFloat32) || instr->GetSrc1()->IsSimd128());
            goto LegalizeDefault;

        case Js::OpCode::NOP:
        {
            Assert(!instr->GetSrc2());
#if _M_IX86
            RegNum edx = RegEDX;
#else
            RegNum edx = RegRDX;
#endif
            // Special case handled by peeps
            Assert(!instr->GetDst() || (instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx));
            break;
        }
        case Js::OpCode::MOVSX:
        case Js::OpCode::MOVSXW:
            Assert(instr->GetDst()->GetSize() == 4 || instr->GetDst()->GetSize() == 8);
            Assert(instr->m_opcode != Js::OpCode::MOVSX || instr->GetSrc1()->GetSize() == 1);
            Assert(instr->m_opcode != Js::OpCode::MOVSXW || instr->GetSrc1()->GetSize() == 2);
            goto LegalizeDefault;

        case Js::OpCode::LOCKCMPXCHG8B:
        case Js::OpCode::CMPXCHG8B:
        {
            const auto getRegMask = [](IR::Opnd* opnd)
            {
                Assert(opnd->IsListOpnd());
                return opnd->AsListOpnd()->Reduce(
                [](int i, IR::Opnd* opnd) {
                    Assert(opnd->IsRegOpnd());
                    return 1 << opnd->AsRegOpnd()->GetReg();
                },
                [](int i, uint32 regmask, uint32 allReg)
                {
                    AssertMsg((allReg & regmask) == 0, "Should not have the same register twice");
                    return allReg | regmask;
                }, 0);
            };
#if _M_IX86
            const uint32 dstMask = (1 << RegEAX | 1 << RegEDX);
            const uint32 srcMask = (1 << RegEAX | 1 << RegEBX | 1 << RegECX | 1 << RegEDX);
#else
            const uint32 dstMask = (1 << RegRAX | 1 << RegRDX);
            const uint32 srcMask = (1 << RegRAX | 1 << RegRBX | 1 << RegRCX | 1 << RegRDX);
#endif

            AssertMsg(!instr->m_func->isPostFinalLower || !instr->GetDst(), "After FinalLower, there should not be a dst");
            AssertMsg(instr->m_func->isPostFinalLower || getRegMask(instr->GetDst()) == dstMask,
                "Before FinalLower, instr should have eax,edx as dst");
            AssertMsg(!instr->m_func->isPostFinalLower || !instr->GetSrc2(), "After FinalLower, there should not be a src2");
            AssertMsg(instr->m_func->isPostFinalLower || getRegMask(instr->GetSrc2()) == srcMask,
                "Before FinalLower, instr should have eax,edx,ecx,ebx as src2");
            LegalizeSrc<verify>(
                instr,
                instr->GetSrc1(),
                L_Mem);
            break;
        }
        case Js::OpCode::TEST:
            if((instr->GetSrc1()->IsImmediateOpnd() && !instr->GetSrc2()->IsImmediateOpnd()) ||
                (instr->GetSrc2()->IsMemoryOpnd() && !instr->GetSrc1()->IsMemoryOpnd()))
            {
                if (verify)
                {
                    AssertMsg(false, "Invalid Js::OpCode::TEST opnd order. Missing legalization");
                    return;
                }
                instr->SwapOpnds();
            }
            goto LegalizeDefault;

        case Js::OpCode::SHL:
        case Js::OpCode::SHR:
        case Js::OpCode::SAR:
        case Js::OpCode::ROL:
        case Js::OpCode::ROR:
            if (verify)
            {
                Assert(instr->GetSrc2()->IsIntConstOpnd()
                    || instr->GetSrc2()->AsRegOpnd()->GetReg() == LowererMDArch::GetRegShiftCount());
            }
            else
            {
                if(!instr->GetSrc2()->IsIntConstOpnd())
                {
                    IR::Instr *const newInstr = instr->HoistSrc2(Js::OpCode::MOV);
                    newInstr->GetDst()->AsRegOpnd()->SetReg(LowererMDArch::GetRegShiftCount());
                    instr->GetSrc2()->AsRegOpnd()->SetReg(LowererMDArch::GetRegShiftCount());
                }
                instr->GetSrc2()->SetType(TyUint8);
            }
            goto LegalizeDefault;

        case Js::OpCode::TZCNT:
            Assert(AutoSystemInfo::Data.TZCntAvailable());
            goto LegalizeDefault;
        case Js::OpCode::LZCNT:
            Assert(AutoSystemInfo::Data.LZCntAvailable());
            goto LegalizeDefault;

        case Js::OpCode::ROUNDSD:
        case Js::OpCode::ROUNDSS:
            Assert(AutoSystemInfo::Data.SSE4_1Available());
            goto LegalizeDefault;

        default:
LegalizeDefault:
            if (isMDOpCode)
            {
                AssertMsg(!isCustomForm, "Custom legal forms should have a case in the switch statement");
                hasSwitchCase = false;

                if (EncoderMD::IsOPEQ(instr))
                {
                    MakeDstEquSrc1<verify>(instr);
                    Assert((dstForms & L_FormMask) == (src1Forms & L_FormMask));
                }

                LegalizeOpnds<verify>(
                    instr,
                    dstForms,
                    src1Forms,
                    src2Forms);
            }
            break;
    }

#if DBG
    // Asserting general rules
    // There should be at most 1 memory opnd in an instruction
    if (instr->GetDst() && instr->GetDst()->IsMemoryOpnd())
    {
        // All memref address need to fit in a dword
        Assert(!instr->GetDst()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetDst()->AsMemRefOpnd()->GetMemLoc()));
        if (instr->GetSrc1())
        {
            Assert(instr->GetSrc1()->IsEqual(instr->GetDst()) || !instr->GetSrc1()->IsMemoryOpnd());
            if (instr->GetSrc2())
            {
                Assert(!instr->GetSrc2()->IsMemoryOpnd());
            }
        }
    }
    else if (instr->GetSrc1() && instr->GetSrc1()->IsMemoryOpnd())
    {
        // All memref address need to fit in a dword
        Assert(!instr->GetSrc1()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetSrc1()->AsMemRefOpnd()->GetMemLoc()));
        Assert(!instr->GetSrc2() || !instr->GetSrc2()->IsMemoryOpnd());
    }
    else if (instr->GetSrc2() && instr->GetSrc2()->IsMemRefOpnd())
    {
        // All memref address need to fit in a dword
        Assert(Math::FitsInDWord((size_t)instr->GetSrc2()->AsMemRefOpnd()->GetMemLoc()));
    }

    // Non-MOV (second operand) immediate need to fit in DWORD for AMD64
    Assert(!instr->GetSrc2() || !instr->GetSrc2()->IsImmediateOpnd()
        || (TySize[instr->GetSrc2()->GetType()] != 8) || Math::FitsInDWord(instr->GetSrc2()->GetImmediateValue(instr->m_func)));
#endif
}